

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O2

void fiobj_json_add2parser(fiobj_json_parser_s *p,FIOBJ o)

{
  FIOBJ ary;
  
  ary = p->top;
  if (ary == 0) {
    p->top = o;
  }
  else {
    if (p->is_hash == '\0') {
      fiobj_ary_push(ary,o);
      return;
    }
    if (p->key == 0) {
      p->key = o;
    }
    else {
      fiobj_hash_set(ary,p->key,o);
      fiobj_free(p->key);
      p->key = 0;
    }
  }
  return;
}

Assistant:

static inline void fiobj_json_add2parser(fiobj_json_parser_s *p, FIOBJ o) {
  if (p->top) {
    if (p->is_hash) {
      if (p->key) {
        fiobj_hash_set(p->top, p->key, o);
        fiobj_free(p->key);
        p->key = FIOBJ_INVALID;
      } else {
        p->key = o;
      }
    } else {
      fiobj_ary_push(p->top, o);
    }
  } else {
    p->top = o;
  }
}